

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O0

void __thiscall
cmListFileBacktrace::Entry::Entry
          (Entry *this,shared_ptr<const_cmListFileBacktrace::Entry> *parent,cmListFileContext *lfc)

{
  cmListFileContext *lfc_local;
  shared_ptr<const_cmListFileBacktrace::Entry> *parent_local;
  Entry *this_local;
  
  cmListFileContext::cmListFileContext((cmListFileContext *)this,lfc);
  std::shared_ptr<const_cmListFileBacktrace::Entry>::shared_ptr(&this->Parent,parent);
  return;
}

Assistant:

Entry(std::shared_ptr<Entry const> parent, cmListFileContext lfc)
    : Context(std::move(lfc))
    , Parent(std::move(parent))
  {
  }